

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void build_cas2(m68k_info *info,int size)

{
  int iVar1;
  uint uVar2;
  m68k_info *info_00;
  int reg_1;
  int reg_0;
  cs_m68k *ext;
  cs_m68k_op *op2;
  cs_m68k_op *op1;
  cs_m68k_op *op0;
  uint extension;
  uint word3;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  m68k_info *in_stack_ffffffffffffffd0;
  m68k_op_mem *pmVar3;
  
  info_00 = (m68k_info *)
            build_init_op(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                          (int)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  peek_imm_32((m68k_info *)0x38a794);
  iVar1 = instruction_is_valid(info_00,in_stack_ffffffffffffffc4);
  if (iVar1 != 0) {
    pmVar3 = &(info_00->extension).operands[1].mem;
    uVar2 = read_imm_32((m68k_info *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    (info_00->extension).operands[0].field_0.reg_pair.reg_1 = M68K_REG_INVALID;
    (info_00->extension).operands[0].field_0.simm = 9.80909e-45;
    *(uint *)&info_00->code = uVar2 >> 0x10 & 7;
    *(uint *)((long)&info_00->code + 4) = uVar2 & 7;
    (info_00->extension).operands[1].field_0.reg_pair.reg_1 = M68K_REG_INVALID;
    (info_00->extension).operands[1].field_0.simm = 9.80909e-45;
    (info_00->extension).operands[0].mem.base_reg = uVar2 >> 0x16 & M68K_REG_D6;
    (info_00->extension).operands[0].mem.index_reg = uVar2 >> 6 & M68K_REG_D6;
    ((m68k_op_br_disp *)(pmVar3 + 1))[3].disp = 0;
    *(undefined4 *)((long)((m68k_op_br_disp *)(pmVar3 + 1) + 2) + 4) = 7;
    iVar1 = 0;
    if ((uVar2 & 0x80000000) != 0) {
      iVar1 = 8;
    }
    pmVar3->base_reg = (uVar2 >> 0x1c & 7) + iVar1;
    iVar1 = 0;
    if ((uVar2 & 0x8000) != 0) {
      iVar1 = 8;
    }
    pmVar3->index_reg = (uVar2 >> 0xc & 7) + iVar1;
  }
  return;
}

Assistant:

static void build_cas2(m68k_info *info, int size)
{
	uint word3;
	uint extension;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k_op* op2;
	cs_m68k* ext = build_init_op(info, M68K_INS_CAS2, 3, size);
	int reg_0, reg_1;

	/* cas2 is the only 3 words instruction, word2 and word3 have the same motif bits to check */
	word3 = peek_imm_32(info) & 0xffff;
	if (!instruction_is_valid(info, word3))
		return;

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];
	op2 = &ext->operands[2];

	extension = read_imm_32(info);

	op0->address_mode = M68K_AM_NONE;
	op0->type = M68K_OP_REG_PAIR;
	op0->reg_pair.reg_0 = (extension >> 16) & 7;
	op0->reg_pair.reg_1 = extension & 7;

	op1->address_mode = M68K_AM_NONE;
	op1->type = M68K_OP_REG_PAIR;
	op1->reg_pair.reg_0 = (extension >> 22) & 7;
	op1->reg_pair.reg_1 = (extension >> 6) & 7;

	reg_0 = (extension >> 28) & 7;
	reg_1 = (extension >> 12) & 7;

	op2->address_mode = M68K_AM_NONE;
	op2->type = M68K_OP_REG_PAIR;
	op2->reg_pair.reg_0 = reg_0 + (BIT_1F(extension) ? 8 : 0);
	op2->reg_pair.reg_1 = reg_1 + (BIT_F(extension) ? 8 : 0);
}